

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O3

void dw4_heroine(dw_rom *rom)

{
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13bc,0x11,0x20,0,0x84,0,0x46,0,0x86,0,0x20,0,0x41,0,0x24,0,0x43,0,0x20);
  vpatch(rom,0x13d4,1,0x20);
  vpatch(rom,0x13dc,0x15,0x20,0,0x84,0,0x66,0,0x86,0,0x20,0,0x41,0,0x62,0,0x43,0,0x20,0,0x45,0,0x66)
  ;
  vpatch(rom,0x15bc,0x13,0x34,0,0x35,0,0x53,0,0x57,0,0x50,0,0x35,0,0x52,0,0x37,0,0x54,0,0x35);
  vpatch(rom,0x15dc,0x17,0x34,0,0x35,0,0x53,0,0x77,0,0x50,0,0x71,0,0x52,0,0x73,0,0x54,0,0x35,0,0x56,
         0,0x77);
  vpatch(rom,0x16b4,0x20,0x40,0,0x44,0,0x42,0,100,0,0x91,0,0x95,0,0x93,0,0x97,0,0x80,0,0x44,0,0x60,0
         ,100,0,0x82,0,0x95,0,0x75,0,0x97,0);
  vpatch(rom,0x16e4,9,0x80,0,0x99,0,0x60,0,0x9b,0,0x82);
  vpatch(rom,0x1a8b,2,0x30,0x1a);
  vpatch(rom,0x12200,0x20,0,0,0,0,0,0,0,0,0x17,0x3f,0x3f,0x1f,0x3f,0x3f,0x3f,0x1f,0,0,0,0,0,0,0,0,
         0xe8,0xfc,0xfc,0xf8,0xfc,0xfc,0xfc,0xf8);
  vpatch(rom,0x12240,0x60,0x18,0x3f,0x7f,0x70,0x1f,0xf,6,0,0x1f,0x1c,0x1f,0x1f,0x1e,8,6,0,0x10,0xfc,
         0xfc,0xf8,0xf0,0xf0,0xe0,0xe0,0xe0,0,0x80,0x10,0x30,0x10,0,0xe0,0,0,0,0,0,0,1,0,0xb,0x1f,
         0x1f,0x3f,0x3f,0x3f,0x1e,0xf,0,0x10,0x38,0x78,0x90,0x70,0xf0,0xe0,0x60,0xe0,0xd8,0x98,0x68,
         0xa0,0x20,0,0xd);
  vpatch(rom,0x12300,0x80,0,0,0,0,0,0,1,0,0xb,0x1f,0x1f,0x3f,0x3f,0x3f,0x1e,0xf,0,0x10,0x38,0x78,
         0x90,0x70,0xf0,0xe0,0x60,0xe0,0xd8,0x98,0x68,0xa0,0x20,0,5,0xf,0xf,0x1c,0x3f,0x3f,0xc,0,6,
         10,0,7,0xf,0x13,0xc,0,0xc0,0xe0,0xe0,0xc0,0xf0,0xe0,0xe0,0x70,0x40,0x20,0x60,0x30,0xf0,0,0,
         0x70,0);
  vpatch(rom,0x12400,0x180,0,4,0xe,0xf,4,7,7,3,3,3,0xd,0xc,0xb,2,2,0,2,2,2,2,2,2,2,2,0xe8,0xfc,0xfc,
         0xf8,0xfc,0xfc,0xfc,0xf8,1,3,3,1,7,3,3,7,0,0,3,2,7,0,0,7,0x10,0xfe,0xfe,0xf0,0xf0,0xf0,0xe0
         ,0xe0,0xe7,1,0x81,0x12,0x32,0x10,0,0xe0,0);
  vpatch(rom,0x12600,0x10,1,0x1b,0x1f,4,7,3,3,7,0x38,0x20,0x23,0x13,0x17,0,0,7);
  vpatch(rom,0x12620,0xf,0x78,0x7f,0x7f,0x70,0x7f,0x6f,6,0,0x1f,0x6c,0x2f,0x2f,0x6e,8,6);
  vpatch(rom,0x12640,0x10,0x20,0xf0,0xf0,0x80,0xf8,0xb0,0xb0,0,0xe0,0xf0,0x70,0x78,0xf8,0,0x30,0);
  vpatch(rom,0x12660,0x10,0x38,0x7f,0x7f,0x70,0x7f,0x37,7,7,0x1f,0x3c,0x3f,0x3f,0x3e,0,0,7);
  vpatch(rom,0x12710,0x10,0,0x80,0xc0,0xe0,0x90,0xe0,0xf0,0xe0,0xe8,0x7c,0xbc,0x98,0x6c,0x5c,0x4c,
         0x18);
  vpatch(rom,0x12730,0x10,0x96,0xfe,0xfe,0x8e,0xfe,0xf6,0xe0,0xe0,0x60,0x36,0xf4,0x74,0xf6,0x10,0,
         0xe0);
  vpatch(rom,0x12750,0x10,9,7,0xf,7,3,7,6,0,4,1,0,0,3,1,6,0);
  vpatch(rom,0x12770,0xf,0x9c,0xfe,0xfe,0xbe,0xfe,0xfc,0x60,0,0x60,0x1c,0xd4,0x54,0xdc,0x80,0x60);
  vpatch(rom,0x12800,0x10,0x10,0x14,0x1e,0x1f,0x14,0x17,0x17,0x13,3,3,0xd,0xc,0xb,2,2,0);
  vpatch(rom,0x12820,0xf,0,4,0xe,0xf,0x44,0x67,0x37,0x1f,3,3,0xd,0xc,0xb,2,2);
  vpatch(rom,0x12840,0x10,0,0,0,0,0,0,0,0,0xe8,0xfc,0xfc,0xf8,0xfc,0xfc,0xfc,0xf8);
  vpatch(rom,0x12860,0x10,0x10,0xf8,0xfc,0xfc,0xf0,0xe0,0x60,0,0xe0,0,0x80,0x10,0x30,0,0x60,0);
  vpatch(rom,0x12910,0x10,0,4,0xe,0xf,4,7,7,3,3,3,0xd,0xc,0xb,2,2,0);
  vpatch(rom,0x12930,0x10,1,3,0xf,7,3,7,6,0,0,1,0,0,3,1,6,0);
  vpatch(rom,0x12950,0x10,0,0,0,0,0x80,0,0xc0,0x80,0x68,0xfc,0xfc,0xfe,0x7e,0xfe,0x3c,0x78);
  vpatch(rom,0x12970,0x90,0x20,0xf0,0xf0,0x80,0xf8,0xf8,0x70,0xe0,0xe0,0xf0,0x70,0x70,0xf8,0x88,0,
         0xe0,0,4,0xe,0xf,4,7,7,3,3,3,0xd,0xc,0xb,2,2,0,0,0,0,0,0x80,0,0xc0,0x80,0x68,0xfc,0xfc,0xfe
         ,0x7e,0xfe,0x3c,0x78,1,3,0xf,4,7,3,3,7,0,0,3,3,7,0,0,7,0x70);
  vpatch(rom,0x12a20,0x70,0x78,0xff,0xff,0xf8,0x7f,0xf,6,0,0x1f,0x2c,0x1f,7,0x1e,8,6,0,0x13,0xff,
         0xfe,0xfc,0xf0,0xf0,0xe0,0xe0,0xef,7,0x82,0x10,0x30,0x10,0,0xe0,0,0,0,0,0,0,0,0,0x17,0x3f,
         0x3f,0x1f,0x3f,0x3f,0x3f,0x1f,0,0,0,0,0,0,0,0,0xe8,0xfc,0xfc,0xf8,0xfc,0xfc,0xfc,0xf8,0x78)
  ;
  vpatch(rom,0x12aa0,0x10,0x6c,0xfe,0xff,0xe7,0xff,0xff,0xfb,0x1c,0x34,0x42,0x10,0x38,0x7f,0x44,0xc3
         ,0x1c);
  vpatch(rom,0x12ac0,0x10,0,1,3,7,9,7,0x1f,0xe,0x36,0x7e,0xfd,0xf9,0x76,0xfa,0xe2,0x70);
  vpatch(rom,0x12ae0,0x10,0x5c,0x7e,0x7e,0xef,0xff,0xfe,0x36,7,0x24,0,0x14,0x32,0x7f,0xc0,0x30,7);
  vpatch(rom,0x12b50,0x10,0,0x60,0xf0,0xf8,4,0xf8,0xfc,0xf8,0xfa,0x9f,0x6f,0x66,0xfb,0x97,0x93,6);
  vpatch(rom,0x12b90,0x10,0,0x80,0xc0,0xe0,0x90,0xe0,0xf8,0x70,0x6c,0x7e,0xbf,0x9f,0x6e,0x5f,0x47,
         0xe);
  vpatch(rom,0x12bd0,0x10,0,0x80,0xc0,0xe0,0x90,0xe0,0xf8,0x70,0x6c,0x7e,0xbe,0x9f,0x6f,0x5f,0x46,
         0xc);
  return;
}

Assistant:

static void dw4_heroine(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013bc,   17,  0x20,  0x00,  0x84,  0x00,  0x46,  0x00,  0x86,  0x00,  0x20,  0x00,  0x41,  0x00,  0x24,  0x00,  0x43,  0x00,  0x20);
    vpatch(rom, 0x013d4,    1,  0x20);
    vpatch(rom, 0x013dc,   21,  0x20,  0x00,  0x84,  0x00,  0x66,  0x00,  0x86,  0x00,  0x20,  0x00,  0x41,  0x00,  0x62,  0x00,  0x43,  0x00,  0x20,  0x00,  0x45,  0x00,  0x66);
    vpatch(rom, 0x015bc,   19,  0x34,  0x00,  0x35,  0x00,  0x53,  0x00,  0x57,  0x00,  0x50,  0x00,  0x35,  0x00,  0x52,  0x00,  0x37,  0x00,  0x54,  0x00,  0x35);
    vpatch(rom, 0x015dc,   23,  0x34,  0x00,  0x35,  0x00,  0x53,  0x00,  0x77,  0x00,  0x50,  0x00,  0x71,  0x00,  0x52,  0x00,  0x73,  0x00,  0x54,  0x00,  0x35,  0x00,  0x56,  0x00,  0x77);
    vpatch(rom, 0x016b4,   32,  0x40,  0x00,  0x44,  0x00,  0x42,  0x00,  0x64,  0x00,  0x91,  0x00,  0x95,  0x00,  0x93,  0x00,  0x97,  0x00,  0x80,  0x00,  0x44,  0x00,  0x60,  0x00,  0x64,  0x00,  0x82,  0x00,  0x95,  0x00,  0x75,  0x00,  0x97,  0x00);
    vpatch(rom, 0x016e4,    9,  0x80,  0x00,  0x99,  0x00,  0x60,  0x00,  0x9b,  0x00,  0x82);
    vpatch(rom, 0x01a8b,    2,  0x30,  0x1a);
    vpatch(rom, 0x12200,   32,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x17,  0x3f,  0x3f,  0x1f,  0x3f,  0x3f,  0x3f,  0x1f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe8,  0xfc,  0xfc,  0xf8,  0xfc,  0xfc,  0xfc,  0xf8);
    vpatch(rom, 0x12240,   96,  0x18,  0x3f,  0x7f,  0x70,  0x1f,  0x0f,  0x06,  0x00,  0x1f,  0x1c,  0x1f,  0x1f,  0x1e,  0x08,  0x06,  0x00,  0x10,  0xfc,  0xfc,  0xf8,  0xf0,  0xf0,  0xe0,  0xe0,  0xe0,  0x00,  0x80,  0x10,  0x30,  0x10,  0x00,  0xe0,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x00,  0x0b,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x1e,  0x0f,  0x00,  0x10,  0x38,  0x78,  0x90,  0x70,  0xf0,  0xe0,  0x60,  0xe0,  0xd8,  0x98,  0x68,  0xa0,  0x20,  0x00,  0x0d,  0x1f,  0x1f,  0x1c,  0x3f,  0x3f,  0x07,  0x03,  0x06,  0x08,  0x03,  0x07,  0x0f,  0x18,  0x00,  0x03,  0xc0,  0xe0,  0xf0,  0x60,  0xf0,  0xf0,  0x30,  0x80,  0x40,  0x20,  0x00,  0x90,  0xf0,  0xc0,  0x30,  0x80);
    vpatch(rom, 0x12300,  128,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x00,  0x0b,  0x1f,  0x1f,  0x3f,  0x3f,  0x3f,  0x1e,  0x0f,  0x00,  0x10,  0x38,  0x78,  0x90,  0x70,  0xf0,  0xe0,  0x60,  0xe0,  0xd8,  0x98,  0x68,  0xa0,  0x20,  0x00,  0x05,  0x0f,  0x0f,  0x1c,  0x3f,  0x3f,  0x0c,  0x00,  0x06,  0x0a,  0x00,  0x07,  0x0f,  0x13,  0x0c,  0x00,  0xc0,  0xe0,  0xe0,  0xc0,  0xf0,  0xe0,  0xe0,  0x70,  0x40,  0x20,  0x60,  0x30,  0xf0,  0x00,  0x00,  0x70,  0x00,  0x01,  0x03,  0x07,  0x08,  0x07,  0x0f,  0x07,  0x17,  0x3e,  0x3d,  0x19,  0x37,  0x3a,  0x32,  0x18,  0x00,  0x80,  0xc0,  0xe0,  0x90,  0xe0,  0xf0,  0xe0,  0xe8,  0x7c,  0xbc,  0x98,  0x6c,  0x5c,  0x4c,  0x18,  0x09,  0x1b,  0x3d,  0x31,  0x0f,  0x0f,  0x06,  0x00,  0x06,  0x04,  0x07,  0x0e,  0x0f,  0x09,  0x06,  0x00,  0x90,  0xf8,  0xf8,  0x80,  0xf0,  0xf0,  0xe0,  0xe0,  0x60,  0x30,  0xf0,  0x70,  0xf0,  0x10,  0x00,  0xe0);
    vpatch(rom, 0x12400,  384,  0x00,  0x04,  0x0e,  0x0f,  0x04,  0x07,  0x07,  0x03,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02,  0x00,  0x02,  0x02,  0x02,  0x02,  0x02,  0x02,  0x02,  0x02,  0xe8,  0xfc,  0xfc,  0xf8,  0xfc,  0xfc,  0xfc,  0xf8,  0x01,  0x03,  0x03,  0x01,  0x07,  0x03,  0x03,  0x07,  0x00,  0x00,  0x03,  0x02,  0x07,  0x00,  0x00,  0x07,  0x10,  0xfe,  0xfe,  0xf0,  0xf0,  0xf0,  0xe0,  0xe0,  0xe7,  0x01,  0x81,  0x12,  0x32,  0x10,  0x00,  0xe0,  0x00,  0x00,  0x00,  0x00,  0x80,  0x00,  0xc0,  0x80,  0x68,  0xfc,  0xfc,  0xfe,  0x7e,  0xfe,  0x3c,  0x78,  0x00,  0x00,  0x00,  0x00,  0x02,  0x02,  0x02,  0x02,  0xe8,  0xfc,  0xfc,  0xf8,  0xfc,  0xfc,  0xfc,  0xf8,  0x78,  0x7f,  0x3f,  0x10,  0x1f,  0x07,  0x07,  0x07,  0x1f,  0x1c,  0x1f,  0x1f,  0x1e,  0x00,  0x00,  0x07,  0x12,  0xf8,  0xfe,  0xf6,  0xf0,  0xe0,  0x60,  0x00,  0xe0,  0x07,  0x81,  0x11,  0x32,  0x00,  0x60,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x00,  0x03,  0x01,  0x16,  0x3f,  0x3f,  0x7f,  0x7e,  0x7f,  0x3c,  0x1e,  0x08,  0x28,  0x78,  0xf8,  0x28,  0xe8,  0xe8,  0xc8,  0xc0,  0xc0,  0xb0,  0x30,  0xd0,  0x40,  0x40,  0x00,  0x1b,  0x3f,  0x3f,  0x38,  0x7f,  0x7f,  0x0e,  0x07,  0x0c,  0x10,  0x06,  0x0f,  0x1f,  0x31,  0x00,  0x07,  0x80,  0xd8,  0xf8,  0xe0,  0xe0,  0xe0,  0x60,  0x00,  0x9c,  0x44,  0x04,  0x08,  0xe8,  0x80,  0x60,  0x00,  0x00,  0x00,  0x00,  0x00,  0x01,  0x00,  0x03,  0x01,  0x16,  0x3f,  0x3f,  0x7f,  0x7e,  0x7f,  0x3c,  0x1e,  0x00,  0x20,  0x70,  0xf0,  0x22,  0xe6,  0xec,  0xf8,  0xc0,  0xc0,  0xb0,  0x30,  0xd0,  0x40,  0x40,  0x00,  0x0b,  0x1f,  0x1f,  0x3b,  0x7f,  0x7e,  0x19,  0x00,  0x0c,  0x14,  0x00,  0x0c,  0x1e,  0x27,  0x18,  0x00,  0xb0,  0xe0,  0x60,  0xa0,  0xa0,  0x40,  0xc0,  0xe0,  0x80,  0x00,  0xa0,  0x40,  0x60,  0x80,  0x00,  0xe0,  0x40,  0x41,  0x43,  0x47,  0x48,  0x47,  0x4f,  0x47,  0x17,  0x3e,  0x3d,  0x19,  0x37,  0x3a,  0x32,  0x18,  0x00,  0x00,  0x71,  0x41,  0x71,  0x11,  0x61,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x49,  0x1b,  0x7d,  0x31,  0x0f,  0x0f,  0x06,  0x00,  0xa6,  0xe4,  0x87,  0x4e,  0x4f,  0x09,  0x06,  0x00,  0x09,  0x1b,  0x1d,  0x01,  0x0f,  0x0f,  0x07,  0x07,  0x06,  0x04,  0x07,  0x0e,  0x0f,  0x08,  0x00,  0x07,  0x00,  0x01,  0x03,  0x07,  0x48,  0x47,  0x4f,  0x47,  0x17,  0x3e,  0x3d,  0x19,  0x37,  0x3a,  0x32,  0x18,  0x00,  0x00,  0x77,  0x44,  0x77,  0x11,  0x66,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x49,  0x5b,  0x5d,  0x01,  0x0f,  0x0f,  0x07,  0x07,  0x06,  0xa4,  0xa7,  0xee,  0x4f,  0x08,  0x00,  0x07,  0x90,  0xf8,  0xfc,  0x8c,  0xf0,  0xf0,  0x60,  0x00,  0x60,  0x30,  0xf0,  0x70,  0xf0,  0x90,  0x60,  0x00);
    vpatch(rom, 0x12600,   16,  0x01,  0x1b,  0x1f,  0x04,  0x07,  0x03,  0x03,  0x07,  0x38,  0x20,  0x23,  0x13,  0x17,  0x00,  0x00,  0x07);
    vpatch(rom, 0x12620,   15,  0x78,  0x7f,  0x7f,  0x70,  0x7f,  0x6f,  0x06,  0x00,  0x1f,  0x6c,  0x2f,  0x2f,  0x6e,  0x08,  0x06);
    vpatch(rom, 0x12640,   16,  0x20,  0xf0,  0xf0,  0x80,  0xf8,  0xb0,  0xb0,  0x00,  0xe0,  0xf0,  0x70,  0x78,  0xf8,  0x00,  0x30,  0x00);
    vpatch(rom, 0x12660,   16,  0x38,  0x7f,  0x7f,  0x70,  0x7f,  0x37,  0x07,  0x07,  0x1f,  0x3c,  0x3f,  0x3f,  0x3e,  0x00,  0x00,  0x07);
    vpatch(rom, 0x12710,   16,  0x00,  0x80,  0xc0,  0xe0,  0x90,  0xe0,  0xf0,  0xe0,  0xe8,  0x7c,  0xbc,  0x98,  0x6c,  0x5c,  0x4c,  0x18);
    vpatch(rom, 0x12730,   16,  0x96,  0xfe,  0xfe,  0x8e,  0xfe,  0xf6,  0xe0,  0xe0,  0x60,  0x36,  0xf4,  0x74,  0xf6,  0x10,  0x00,  0xe0);
    vpatch(rom, 0x12750,   16,  0x09,  0x07,  0x0f,  0x07,  0x03,  0x07,  0x06,  0x00,  0x04,  0x01,  0x00,  0x00,  0x03,  0x01,  0x06,  0x00);
    vpatch(rom, 0x12770,   15,  0x9c,  0xfe,  0xfe,  0xbe,  0xfe,  0xfc,  0x60,  0x00,  0x60,  0x1c,  0xd4,  0x54,  0xdc,  0x80,  0x60);
    vpatch(rom, 0x12800,   16,  0x10,  0x14,  0x1e,  0x1f,  0x14,  0x17,  0x17,  0x13,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02,  0x00);
    vpatch(rom, 0x12820,   15,  0x00,  0x04,  0x0e,  0x0f,  0x44,  0x67,  0x37,  0x1f,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02);
    vpatch(rom, 0x12840,   16,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe8,  0xfc,  0xfc,  0xf8,  0xfc,  0xfc,  0xfc,  0xf8);
    vpatch(rom, 0x12860,   16,  0x10,  0xf8,  0xfc,  0xfc,  0xf0,  0xe0,  0x60,  0x00,  0xe0,  0x00,  0x80,  0x10,  0x30,  0x00,  0x60,  0x00);
    vpatch(rom, 0x12910,   16,  0x00,  0x04,  0x0e,  0x0f,  0x04,  0x07,  0x07,  0x03,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02,  0x00);
    vpatch(rom, 0x12930,   16,  0x01,  0x03,  0x0f,  0x07,  0x03,  0x07,  0x06,  0x00,  0x00,  0x01,  0x00,  0x00,  0x03,  0x01,  0x06,  0x00);
    vpatch(rom, 0x12950,   16,  0x00,  0x00,  0x00,  0x00,  0x80,  0x00,  0xc0,  0x80,  0x68,  0xfc,  0xfc,  0xfe,  0x7e,  0xfe,  0x3c,  0x78);
    vpatch(rom, 0x12970,  144,  0x20,  0xf0,  0xf0,  0x80,  0xf8,  0xf8,  0x70,  0xe0,  0xe0,  0xf0,  0x70,  0x70,  0xf8,  0x88,  0x00,  0xe0,  0x00,  0x04,  0x0e,  0x0f,  0x04,  0x07,  0x07,  0x03,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x00,  0xc0,  0x80,  0x68,  0xfc,  0xfc,  0xfe,  0x7e,  0xfe,  0x3c,  0x78,  0x01,  0x03,  0x0f,  0x04,  0x07,  0x03,  0x03,  0x07,  0x00,  0x00,  0x03,  0x03,  0x07,  0x00,  0x00,  0x07,  0x70,  0xf8,  0xf8,  0xf8,  0xfc,  0xfc,  0x98,  0x00,  0x80,  0x70,  0x50,  0x50,  0x74,  0x04,  0x18,  0x00,  0x00,  0x04,  0x0e,  0x0f,  0x04,  0x07,  0x07,  0x03,  0x03,  0x03,  0x0d,  0x0c,  0x0b,  0x02,  0x02,  0x00,  0x00,  0x00,  0x00,  0x00,  0x80,  0x00,  0xc0,  0x80,  0x68,  0xfc,  0xfc,  0xfe,  0x7e,  0xfe,  0x3c,  0x78,  0x0d,  0x0f,  0x0f,  0x0f,  0x0f,  0x0f,  0x06,  0x00,  0x00,  0x0d,  0x04,  0x04,  0x0d,  0x01,  0x06,  0x00,  0x20,  0xf0,  0xf0,  0xc0,  0xf8,  0xf8,  0x70,  0xe0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf8,  0x88,  0x00,  0xe0);
    vpatch(rom, 0x12a20,  112,  0x78,  0xff,  0xff,  0xf8,  0x7f,  0x0f,  0x06,  0x00,  0x1f,  0x2c,  0x1f,  0x07,  0x1e,  0x08,  0x06,  0x00,  0x13,  0xff,  0xfe,  0xfc,  0xf0,  0xf0,  0xe0,  0xe0,  0xef,  0x07,  0x82,  0x10,  0x30,  0x10,  0x00,  0xe0,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x17,  0x3f,  0x3f,  0x1f,  0x3f,  0x3f,  0x3f,  0x1f,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0x00,  0xe8,  0xfc,  0xfc,  0xf8,  0xfc,  0xfc,  0xfc,  0xf8,  0x78,  0xff,  0xff,  0xf8,  0x73,  0x1f,  0x1e,  0x0e,  0x1f,  0x2c,  0x1f,  0x07,  0x0e,  0x1c,  0x10,  0x0e,  0x13,  0xff,  0xfe,  0xfc,  0xf0,  0xe0,  0xe0,  0x00,  0xef,  0x07,  0x82,  0x10,  0x30,  0x00,  0xe0,  0x00,  0x00,  0x01,  0x03,  0x07,  0x09,  0x07,  0x1f,  0x0e,  0x36,  0x7e,  0x7d,  0xf9,  0xf6,  0xfa,  0x62,  0x30);
    vpatch(rom, 0x12aa0,   16,  0x6c,  0xfe,  0xff,  0xe7,  0xff,  0xff,  0xfb,  0x1c,  0x34,  0x42,  0x10,  0x38,  0x7f,  0x44,  0xc3,  0x1c);
    vpatch(rom, 0x12ac0,   16,  0x00,  0x01,  0x03,  0x07,  0x09,  0x07,  0x1f,  0x0e,  0x36,  0x7e,  0xfd,  0xf9,  0x76,  0xfa,  0xe2,  0x70);
    vpatch(rom, 0x12ae0,   16,  0x5c,  0x7e,  0x7e,  0xef,  0xff,  0xfe,  0x36,  0x07,  0x24,  0x00,  0x14,  0x32,  0x7f,  0xc0,  0x30,  0x07);
    vpatch(rom, 0x12b50,   16,  0x00,  0x60,  0xf0,  0xf8,  0x04,  0xf8,  0xfc,  0xf8,  0xfa,  0x9f,  0x6f,  0x66,  0xfb,  0x97,  0x93,  0x06);
    vpatch(rom, 0x12b90,   16,  0x00,  0x80,  0xc0,  0xe0,  0x90,  0xe0,  0xf8,  0x70,  0x6c,  0x7e,  0xbf,  0x9f,  0x6e,  0x5f,  0x47,  0x0e);
    vpatch(rom, 0x12bd0,   16,  0x00,  0x80,  0xc0,  0xe0,  0x90,  0xe0,  0xf8,  0x70,  0x6c,  0x7e,  0xbe,  0x9f,  0x6f,  0x5f,  0x46,  0x0c);
}